

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O3

int __thiscall OpenMD::ElementsTable::GetAtomicNum(ElementsTable *this,char *identifier,int *iso)

{
  pointer ppEVar1;
  Element *pEVar2;
  pointer pcVar3;
  long *plVar4;
  int iVar5;
  size_t sVar6;
  size_t __n;
  pointer ppEVar7;
  pointer ppEVar8;
  long *local_50 [2];
  long local_40 [2];
  
  if (this->init_ == false) {
    Init(this);
  }
  ppEVar8 = (this->elements_).
            super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (this->elements_).
            super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppEVar7 = ppEVar8;
  if (ppEVar8 != ppEVar1) {
    do {
      pEVar2 = *ppEVar7;
      iVar5 = strncasecmp(identifier,(pEVar2->symbol_)._M_dataplus._M_p,3);
      if (iVar5 == 0) {
        return pEVar2->num_;
      }
      ppEVar7 = ppEVar7 + 1;
    } while (ppEVar7 != ppEVar1);
    if (ppEVar8 != ppEVar1) {
      sVar6 = strlen(identifier);
      __n = 5;
      if (5 < (int)sVar6) {
        __n = sVar6 & 0xffffffff;
      }
      do {
        pcVar3 = ((*ppEVar8)->name_)._M_dataplus._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar3,pcVar3 + ((*ppEVar8)->name_)._M_string_length);
        plVar4 = local_50[0];
        iVar5 = strncasecmp(identifier,(char *)local_50[0],__n);
        if (plVar4 != local_40) {
          operator_delete(plVar4,local_40[0] + 1);
        }
        if (iVar5 == 0) {
          return (*ppEVar8)->num_;
        }
        ppEVar8 = ppEVar8 + 1;
      } while (ppEVar8 !=
               (this->elements_).
               super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  iVar5 = strcasecmp(identifier,"D");
  if ((iVar5 == 0) || (iVar5 = strcasecmp(identifier,"Deuterium"), iVar5 == 0)) {
    *iso = 2;
  }
  else {
    iVar5 = strcasecmp(identifier,"T");
    if ((iVar5 == 0) || (iVar5 = strcasecmp(identifier,"Tritium"), iVar5 == 0)) {
      *iso = 3;
    }
    else {
      iVar5 = strcasecmp(identifier,"Hl");
      if (iVar5 != 0) {
        *iso = 0;
        return 0;
      }
      snprintf(painCave.errMsg,2000,
               "ElementsTable warning.\n\tCannot understand the element label %s\n\tGuessing it\'s hydrogen\n"
               ,identifier);
      painCave.isFatal = 0;
      painCave.severity = 2;
      simError();
    }
  }
  return 1;
}

Assistant:

int ElementsTable::GetAtomicNum(const char* identifier, int& iso) {
    if (!init_) Init();

    // Compare to symbol
    std::vector<Element*>::iterator i;
    for (i = elements_.begin(); i != elements_.end(); ++i)
      if (!strncasecmp(identifier, (*i)->GetSymbol(), 3))
        return ((*i)->GetAtomicNum());

    // Compare to IUPAC name (an abbreviated name will also work if 5
    // letters or more)
    int numCharsToTest = std::max<int>(strlen(identifier), 5);
    for (i = elements_.begin(); i != elements_.end(); ++i)
      if (strncasecmp(identifier, (*i)->GetName().c_str(), numCharsToTest) == 0)
        return ((*i)->GetAtomicNum());

    if (strcasecmp(identifier, "D") == 0 ||
        (strcasecmp(identifier, "Deuterium") == 0)) {
      iso = 2;
      return (1);
    } else if (strcasecmp(identifier, "T") == 0 ||
               (strcasecmp(identifier, "Tritium") == 0)) {
      iso = 3;
      return (1);
    } else if (strcasecmp(identifier, "Hl") == 0) {
      // ligand hydrogen -- found in some CIF PR#3048959.
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ElementsTable warning.\n"
               "\tCannot understand the element label %s\n"
               "\tGuessing it's hydrogen\n",
               identifier);
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_WARNING;
      simError();
      return (1);
    } else
      iso = 0;

    if (identifier[0] != '*') {
      // Quiet down the error messages for now:
      // snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //          "ElementsTable warning.\n"
      //          "\tCannot understand the element label %s\n", identifier);
      // painCave.isFatal = 0;
      // painCave.severity = OPENMD_WARNING;
      // simError();
    }
    return (0);
  }